

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedCapacityPriorityQueue.h
# Opt level: O0

bool __thiscall
FixedCapacityPriorityQueue<boost::shared_ptr<PartialJPDPValuePair>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
::insert(FixedCapacityPriorityQueue<boost::shared_ptr<PartialJPDPValuePair>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
         *this,shared_ptr<PartialJPDPValuePair> *a,shared_ptr<PartialJPDPValuePair> *overflown_T)

{
  bool bVar1;
  byte bVar2;
  _List_node_base *p_Var3;
  const_iterator in_RDI;
  less<boost::shared_ptr<PartialJPDPValuePair>_> theLessOp_1;
  bool not_positioned;
  iterator last;
  iterator it;
  less<boost::shared_ptr<PartialJPDPValuePair>_> theLessOp;
  shared_ptr<PartialJPDPValuePair> *last_in_queue;
  bool skip_insert;
  bool overflow;
  shared_ptr<PartialJPDPValuePair> *in_stack_ffffffffffffff18;
  shared_ptr<PartialJPDPValuePair> *r;
  shared_ptr<PartialJPDPValuePair> *in_stack_ffffffffffffff20;
  undefined6 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2e;
  undefined1 in_stack_ffffffffffffff2f;
  PartialJPDPValuePair_sharedPtr *in_stack_ffffffffffffff30;
  PartialJPDPValuePair_sharedPtr *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  byte in_stack_ffffffffffffff47;
  _List_const_iterator<boost::shared_ptr<PartialJPDPValuePair>_> local_a8;
  _List_node_base *local_a0;
  shared_ptr<PartialJPDPValuePair> local_98;
  shared_ptr<PartialJPDPValuePair> local_88;
  byte local_71;
  _Self local_70;
  _Self local_68 [3];
  PartialJPDPValuePair_sharedPtr local_50;
  PartialJPDPValuePair_sharedPtr local_40;
  reference local_28;
  byte local_1a;
  byte local_19;
  
  p_Var3 = (_List_node_base *)
           std::__cxx11::
           list<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
           ::size((list<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
                   *)in_stack_ffffffffffffff20);
  local_19 = p_Var3 == in_RDI._M_node[1]._M_prev;
  local_1a = 0;
  if ((bool)local_19) {
    local_28 = std::__cxx11::
               list<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
               ::back((list<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
                       *)in_stack_ffffffffffffff20);
    in_stack_ffffffffffffff30 = &local_40;
    boost::shared_ptr<PartialJPDPValuePair>::shared_ptr
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff38 = &local_50;
    boost::shared_ptr<PartialJPDPValuePair>::shared_ptr
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff47 =
         std::less<boost::shared_ptr<PartialJPDPValuePair>_>::operator()
                   ((less<boost::shared_ptr<PartialJPDPValuePair>_> *)
                    CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                    in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    boost::shared_ptr<PartialJPDPValuePair>::~shared_ptr
              ((shared_ptr<PartialJPDPValuePair> *)0x8d216c);
    boost::shared_ptr<PartialJPDPValuePair>::~shared_ptr
              ((shared_ptr<PartialJPDPValuePair> *)0x8d2179);
    if ((in_stack_ffffffffffffff47 & 1) == 0) {
      boost::shared_ptr<PartialJPDPValuePair>::operator=
                (in_stack_ffffffffffffff30,
                 (shared_ptr<PartialJPDPValuePair> *)
                 CONCAT17(in_stack_ffffffffffffff2f,
                          CONCAT16(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28)));
      local_1a = 1;
    }
    else {
      boost::shared_ptr<PartialJPDPValuePair>::operator=
                (in_stack_ffffffffffffff30,
                 (shared_ptr<PartialJPDPValuePair> *)
                 CONCAT17(in_stack_ffffffffffffff2f,
                          CONCAT16(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28)));
      std::__cxx11::
      list<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
      ::pop_back((list<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
                  *)in_stack_ffffffffffffff20);
    }
  }
  if ((local_1a & 1) == 0) {
    local_68[0]._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
         ::begin((list<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
                  *)in_stack_ffffffffffffff18);
    local_70._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
         ::end((list<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
                *)in_stack_ffffffffffffff18);
    local_71 = 1;
    while( true ) {
      bVar1 = std::operator!=(local_68,&local_70);
      bVar2 = local_71;
      if (!bVar1) {
        bVar2 = 0;
      }
      if ((bVar2 & 1) == 0) break;
      std::_List_iterator<boost::shared_ptr<PartialJPDPValuePair>_>::operator*
                ((_List_iterator<boost::shared_ptr<PartialJPDPValuePair>_> *)0x8d226d);
      r = &local_88;
      boost::shared_ptr<PartialJPDPValuePair>::shared_ptr(in_stack_ffffffffffffff20,r);
      in_stack_ffffffffffffff20 = &local_98;
      boost::shared_ptr<PartialJPDPValuePair>::shared_ptr(in_stack_ffffffffffffff20,r);
      bVar2 = std::less<boost::shared_ptr<PartialJPDPValuePair>_>::operator()
                        ((less<boost::shared_ptr<PartialJPDPValuePair>_> *)
                         CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      boost::shared_ptr<PartialJPDPValuePair>::~shared_ptr
                ((shared_ptr<PartialJPDPValuePair> *)0x8d22b8);
      boost::shared_ptr<PartialJPDPValuePair>::~shared_ptr
                ((shared_ptr<PartialJPDPValuePair> *)0x8d22c2);
      if ((bVar2 & 1) == 0) {
        local_a0 = (_List_node_base *)
                   std::_List_iterator<boost::shared_ptr<PartialJPDPValuePair>_>::operator++
                             (local_68,0);
      }
      else {
        local_71 = 0;
      }
    }
    std::_List_const_iterator<boost::shared_ptr<PartialJPDPValuePair>_>::_List_const_iterator
              (&local_a8,local_68);
    std::__cxx11::
    list<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
    ::insert((list<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
              *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),in_RDI,
             in_stack_ffffffffffffff38);
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool FixedCapacityPriorityQueue<T,_Compare>::insert( T& a, T& overflown_T )
{
    bool overflow = ( _m_l.size() == _m_capacity);
    bool skip_insert = false;

    if(overflow) //check if we need to make space at the end
    {
        // overflown_Tp is the T* to which overflown_Tpp points
        // we set the former to point to the overflown element.
        //T* & overflown_Tp = *overflown_Tpp;

        T& last_in_queue = _m_l.back();
        //std::less< T > theLessOp;
        _Compare theLessOp;
        if( theLessOp( last_in_queue,  a) )
        //if( last_in_queue <  a ) //doesn't work automatically...
        {
            //This does not work with (or need) pointers, 
            //this simply points to last position in queue !!!
            //overflown_Tp = &last_in_queue;             
            
            //rather copy the value of the stuff we will throw out!
            overflown_T = last_in_queue; 
            _m_l.pop_back();
        }
        else
        {
            overflown_T = a;
            skip_insert = true;
        }
    }

    if(!skip_insert)
    {
        //insert a at the appropriate place
        typename std::list<T>::iterator it = _m_l.begin();
        typename std::list<T>::iterator last = _m_l.end();
        bool not_positioned = true; //so long as it does not point to the correct pos.
        //std::less< T > theLessOp;
        _Compare theLessOp;
        while(it != last && not_positioned)
        {
            if( theLessOp( *it, a ) )
                not_positioned = false;
            else
                it++;
        }
        _m_l.insert( it, a);
    }
#if 0 && DEBUG_FCPQ
    std::cout << "----AFTER POP AND INSERT\nthe overflown_Tp=" <<overflown_Tp << ", which means it points to..." <<std::endl ;
    if(overflown_Tp != NULL)
    {
        T& the_overflown_T = (*overflown_Tp);
        std::string typestr = " JPPVValPair* ";
        std::cout << "the_overflown_T [T="<< typestr <<
            "]=" << the_overflown_T << ", which points to..."<<std::endl;

        if(the_overflown_T != NULL)
            std::cout<< (*the_overflown_T).SoftPrintBrief() << std::endl;
        else
            std::cout << "nothing" <<std::endl;
    }
    else
        std::cout << " nothing." << std::endl;
    
    std::cout << "----" <<std::endl ;
#endif
    
    return(overflow);
}